

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

qsizetype indexOf_helper<QLatin1String>
                    (QStringList *that,QLatin1String needle,qsizetype from,CaseSensitivity cs)

{
  QStringView other;
  int iVar1;
  qsizetype qVar2;
  QStringView *in_RCX;
  QList<QString> *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype i;
  QLatin1String *in_stack_ffffffffffffff78;
  QList<QString> *in_stack_ffffffffffffff80;
  QStringView *this;
  undefined4 in_stack_ffffffffffffffa8;
  QStringView *local_50;
  QStringView *local_40;
  int local_24;
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = in_RCX;
  if ((long)in_RCX < 0) {
    qVar2 = QList<QString>::size(in_RDI);
    local_20[0] = (long)&((DataPointer *)&in_RCX->m_size)->d + qVar2;
    local_24 = 0;
    local_50 = (QStringView *)qMax<long_long,int>(local_20,&local_24);
  }
  this = local_50;
  qVar2 = QList<QString>::size(in_RDI);
  if ((long)this < qVar2) {
    while (local_40 = local_50, qVar2 = QList<QString>::size(in_RDI), (long)local_50 < qVar2) {
      QList<QString>::at(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
      QStringView::QStringView<QString,_true>(this,(QString *)local_50);
      other.m_data._0_4_ = in_stack_ffffffffffffffa8;
      other.m_size = (qsizetype)local_40;
      other.m_data._4_4_ = in_R8D;
      iVar1 = QLatin1String::compare(in_stack_ffffffffffffff78,other,CaseInsensitive);
      if (iVar1 == 0) goto LAB_0054e657;
      local_50 = (QStringView *)((long)&((DataPointer *)&local_40->m_size)->d + 1);
    }
    local_40 = (QStringView *)0xffffffffffffffff;
  }
  else {
    local_40 = (QStringView *)0xffffffffffffffff;
  }
LAB_0054e657:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qsizetype)local_40;
}

Assistant:

qsizetype indexOf_helper(const QStringList &that, String needle, qsizetype from,
                         Qt::CaseSensitivity cs)
{
    if (from < 0) // Historical behavior
        from = qMax(from + that.size(), 0);

    if (from >= that.size())
        return -1;

    for (qsizetype i = from; i < that.size(); ++i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }
    return -1;
}